

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall just::test::assert_throw::run<void(*)()>(assert_throw *this,_func_void *f_)

{
  string local_38;
  
  (*f_)();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Expression did not throw.","");
  assert_msg::operator()(&this->_assert_msg,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

impl::nothing_to_run run(F f_) const
      {
        try
        {
          f_();
        }
        catch (...)
        {
          return impl::nothing_to_run();
        }

        _assert_msg("Expression did not throw.", false);

        return impl::nothing_to_run();
      }